

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O0

void __thiscall SDLInputJoystick::ProcessInput(SDLInputJoystick *this)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  AxisInfo *pAVar4;
  AxisInfo *pAVar5;
  double dVar6;
  AxisInfo *y;
  AxisInfo *x;
  int local_18;
  int i_1;
  int i;
  BYTE buttonstate;
  SDLInputJoystick *this_local;
  
  _i = this;
  for (local_18 = 0; local_18 < this->NumAxes; local_18 = local_18 + 1) {
    i_1._3_1_ = 0;
    sVar2 = SDL_JoystickGetAxis(this->Device,local_18);
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,(long)local_18);
    pAVar4->Value = (double)(int)sVar2 / 32767.0;
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,(long)local_18);
    dVar6 = pAVar4->Value;
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,(long)local_18);
    dVar6 = Joy_RemoveDeadZone(dVar6,(double)pAVar4->DeadZone,(BYTE *)((long)&i_1 + 3));
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,(long)local_18);
    pAVar4->Value = dVar6;
    if ((this->NumAxes == 1) || ((1 < local_18 && (local_18 < 8)))) {
      pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                         (&this->Axes,(long)local_18);
      Joy_GenerateButtonEvents((uint)pAVar4->ButtonValue,(uint)i_1._3_1_,2,local_18 * 2 + 0x19c);
      bVar1 = i_1._3_1_;
      pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                         (&this->Axes,(long)local_18);
      pAVar4->ButtonValue = bVar1;
    }
  }
  if (1 < this->NumAxes) {
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,0);
    dVar6 = pAVar4->Value;
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,1);
    iVar3 = Joy_XYAxesToButtons(dVar6,pAVar4->Value);
    i_1._3_1_ = (byte)iVar3;
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,0);
    Joy_GenerateButtonEvents((uint)pAVar4->ButtonValue,(uint)i_1._3_1_,4,0x19c);
    bVar1 = i_1._3_1_;
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,0);
    pAVar4->ButtonValue = bVar1;
  }
  for (x._4_4_ = 0; x._4_4_ < this->NumHats; x._4_4_ = x._4_4_ + 1) {
    pAVar4 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,(long)(this->NumAxes + x._4_4_ * 2));
    pAVar5 = TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::operator[]
                       (&this->Axes,(long)(this->NumAxes + x._4_4_ * 2 + 1));
    i_1._3_1_ = SDL_JoystickGetHat(this->Device,x._4_4_);
    if ((i_1._3_1_ & 1) == 0) {
      if ((i_1._3_1_ & 4) == 0) {
        pAVar5->Value = 0.0;
      }
      else {
        pAVar5->Value = 1.0;
      }
    }
    else {
      pAVar5->Value = -1.0;
    }
    if ((i_1._3_1_ & 2) == 0) {
      if ((i_1._3_1_ & 8) == 0) {
        pAVar4->Value = 0.0;
      }
      else {
        pAVar4->Value = -1.0;
      }
    }
    else {
      pAVar4->Value = 1.0;
    }
    if (x._4_4_ < 4) {
      Joy_GenerateButtonEvents((uint)pAVar4->ButtonValue,(uint)i_1._3_1_,4,x._4_4_ * 4 + 0x188);
      pAVar4->ButtonValue = i_1._3_1_;
    }
  }
  return;
}

Assistant:

void ProcessInput()
	{
		BYTE buttonstate;

		for (int i = 0; i < NumAxes; ++i)
		{
			buttonstate = 0;

			Axes[i].Value = SDL_JoystickGetAxis(Device, i)/32767.0;
			Axes[i].Value = Joy_RemoveDeadZone(Axes[i].Value, Axes[i].DeadZone, &buttonstate);

			// Map button to axis
			// X and Y are handled differently so if we have 2 or more axes then we'll use that code instead.
			if (NumAxes == 1 || (i >= 2 && i < NUM_JOYAXISBUTTONS))
			{
				Joy_GenerateButtonEvents(Axes[i].ButtonValue, buttonstate, 2, KEY_JOYAXIS1PLUS + i*2);
				Axes[i].ButtonValue = buttonstate;
			}
		}

		if(NumAxes > 1)
		{
			buttonstate = Joy_XYAxesToButtons(Axes[0].Value, Axes[1].Value);
			Joy_GenerateButtonEvents(Axes[0].ButtonValue, buttonstate, 4, KEY_JOYAXIS1PLUS);
			Axes[0].ButtonValue = buttonstate;
		}

		// Map POV hats to buttons and axes.  Why axes?  Well apparently I have
		// a gamepad where the left control stick is a POV hat (instead of the
		// d-pad like you would expect, no that's pressure sensitive).  Also
		// KDE's joystick dialog maps them to axes as well.
		for (int i = 0; i < NumHats; ++i)
		{
			AxisInfo &x = Axes[NumAxes + i*2];
			AxisInfo &y = Axes[NumAxes + i*2 + 1];

			buttonstate = SDL_JoystickGetHat(Device, i);

			// If we're going to assume that we can pass SDL's value into
			// Joy_GenerateButtonEvents then we might as well assume the format here.
			if(buttonstate & 0x1) // Up
				y.Value = -1.0;
			else if(buttonstate & 0x4) // Down
				y.Value = 1.0;
			else
				y.Value = 0.0;
			if(buttonstate & 0x2) // Left
				x.Value = 1.0;
			else if(buttonstate & 0x8) // Right
				x.Value = -1.0;
			else
				x.Value = 0.0;

			if(i < 4)
			{
				Joy_GenerateButtonEvents(x.ButtonValue, buttonstate, 4, KEY_JOYPOV1_UP + i*4);
				x.ButtonValue = buttonstate;
			}
		}
	}